

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriter.cpp
# Opt level: O0

void __thiscall MILBlob::Blob::StorageWriter::Impl::~Impl(Impl *this)

{
  Impl *this_local;
  
  std::unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>::
  ~unique_ptr(&this->m_fileWriter);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Impl() = default;